

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O0

h__Reader * __thiscall
AS_02::ACES::MXFReader::h__Reader::FillAncillaryResourceDescriptor
          (h__Reader *this,ResourceList_t *ancillary_resources)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ILogSink *this_00;
  bool bVar4;
  AncillaryResourceDescriptor TmpResource;
  InterchangeObject *tmp_iobj;
  __normal_iterator<Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_> local_b0;
  Result_t local_a8 [8];
  Result_t result;
  TargetFrameSubDescriptor *DescObject;
  __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
  local_30;
  const_iterator sdi;
  RGBAEssenceDescriptor *TDescObj;
  ResourceList_t *ancillary_resources_local;
  h__Reader *this_local;
  
  if (ancillary_resources[0x37].
      super__List_base<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
      ._M_impl._M_node.super__List_node_base._M_prev == (_List_node_base *)0x0) {
    __assert_fail("m_EssenceDescriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_ACES.cpp"
                  ,0x1ac,
                  "AS_02::Result_t AS_02::ACES::MXFReader::h__Reader::FillAncillaryResourceDescriptor(AS_02::ACES::ResourceList_t &)"
                 );
  }
  sdi._M_current =
       (UUID *)ancillary_resources[0x37].
               super__List_base<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
  DescObject = (TargetFrameSubDescriptor *)
               std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::begin
                         ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                          &((_List_node_base *)((long)sdi._M_current + 0xc0))->_M_prev);
  __gnu_cxx::__normal_iterator<Kumu::UUID_const*,std::vector<Kumu::UUID,std::allocator<Kumu::UUID>>>
  ::__normal_iterator<Kumu::UUID*>
            ((__normal_iterator<Kumu::UUID_const*,std::vector<Kumu::UUID,std::allocator<Kumu::UUID>>>
              *)&local_30,
             (__normal_iterator<Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
              *)&DescObject);
  Kumu::Result_t::Result_t(local_a8,(Result_t *)Kumu::RESULT_OK);
  while( true ) {
    local_b0._M_current =
         (UUID *)std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::end
                           ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                            &sdi._M_current[6].super_Identifier<16U>.m_HasValue);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_b0);
    bVar4 = false;
    if (bVar1) {
      iVar3 = Kumu::Result_t::operator_cast_to_int(local_a8);
      bVar4 = -1 < iVar3;
    }
    if (!bVar4) break;
    __gnu_cxx::
    __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::
    operator*(&local_30);
    ASDCP::MXF::OP1aHeader::GetMDObjectByID
              ((UUID *)((long)&TmpResource.filePath.field_2 + 8),
               (InterchangeObject **)(ancillary_resources + 1));
    Kumu::Result_t::operator=(local_a8,(Result_t *)(TmpResource.filePath.field_2._M_local_buf + 8));
    Kumu::Result_t::~Result_t((Result_t *)(TmpResource.filePath.field_2._M_local_buf + 8));
    ASDCP::Dictionary::ul
              ((Dictionary *)
               (ancillary_resources->
               super__List_base<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
               )._M_impl._M_node.super__List_node_base._M_prev,MDD_TargetFrameSubDescriptor);
    bVar2 = (**(code **)(lRam0000000000000000 + 0x78))();
    if ((bVar2 & 1) != 0) {
      Kumu::Result_t::operator_cast_to_int(local_a8);
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(this_00,"Broken sub-descriptor link\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
LAB_001b0661:
      Kumu::Result_t::~Result_t(local_a8);
      return this;
    }
    __gnu_cxx::
    __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::
    operator++(&local_30,0);
  }
  Kumu::Result_t::Result_t((Result_t *)this,local_a8);
  goto LAB_001b0661;
}

Assistant:

AS_02::Result_t AS_02::ACES::MXFReader::h__Reader::FillAncillaryResourceDescriptor(AS_02::ACES::ResourceList_t &ancillary_resources)
{

  assert(m_EssenceDescriptor);
  ASDCP::MXF::RGBAEssenceDescriptor* TDescObj = (ASDCP::MXF::RGBAEssenceDescriptor*)m_EssenceDescriptor;

  Array<Kumu::UUID>::const_iterator sdi = TDescObj->SubDescriptors.begin();
  TargetFrameSubDescriptor* DescObject = NULL;
  Result_t result = RESULT_OK;

  for(; sdi != TDescObj->SubDescriptors.end() && KM_SUCCESS(result); sdi++)
  {
    InterchangeObject* tmp_iobj = NULL;
    result = m_HeaderPart.GetMDObjectByID(*sdi, &tmp_iobj);
    if (!tmp_iobj->IsA(m_Dict->ul(MDD_TargetFrameSubDescriptor)))
        continue;
    DescObject = static_cast<TargetFrameSubDescriptor*>(tmp_iobj);
    if(KM_SUCCESS(result) && DescObject)
    {
      AncillaryResourceDescriptor TmpResource; 
      memcpy(TmpResource.ResourceID, DescObject->TargetFrameAncillaryResourceID.Value(), UUIDlen);
      
      if(DescObject->MediaType.find("image/png") != std::string::npos)
      {
        TmpResource.Type = AS_02::ACES::MT_PNG;
      }
      else if(DescObject->MediaType.find("image/tiff") != std::string::npos)
      {
        TmpResource.Type = AS_02::ACES::MT_TIFF;
      }
      else
      {
        TmpResource.Type = AS_02::ACES::MT_UNDEF;
      }

      ancillary_resources.push_back(TmpResource);
      m_ResourceMap.insert(ResourceMap_t::value_type(DescObject->TargetFrameAncillaryResourceID, *sdi));
    }
    else
    {
      DefaultLogSink().Error("Broken sub-descriptor link\n");
      return RESULT_FORMAT;
    }
  }

  return result;
}